

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

char * get_full_container_name(container_t *c,uint8_t typecode)

{
  char cVar1;
  uint8_t typecode_local;
  container_t *c_local;
  
  switch(typecode) {
  case '\x01':
    c_local = container_names[0];
    break;
  case '\x02':
    c_local = container_names[1];
    break;
  case '\x03':
    c_local = container_names[2];
    break;
  case '\x04':
    cVar1 = *(char *)((long)c + 8);
    if (cVar1 == '\x01') {
      c_local = shared_container_names[0];
    }
    else if (cVar1 == '\x02') {
      c_local = shared_container_names[1];
    }
    else {
      if (cVar1 != '\x03') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x10dd,"const char *get_full_container_name(const container_t *, uint8_t)");
      }
      c_local = shared_container_names[2];
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x10e3,"const char *get_full_container_name(const container_t *, uint8_t)");
  }
  return (char *)c_local;
}

Assistant:

static inline const char *get_full_container_name(
    const container_t *c, uint8_t typecode
){
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return container_names[0];
        case ARRAY_CONTAINER_TYPE:
            return container_names[1];
        case RUN_CONTAINER_TYPE:
            return container_names[2];
        case SHARED_CONTAINER_TYPE:
            switch (const_CAST_shared(c)->typecode) {
                case BITSET_CONTAINER_TYPE:
                    return shared_container_names[0];
                case ARRAY_CONTAINER_TYPE:
                    return shared_container_names[1];
                case RUN_CONTAINER_TYPE:
                    return shared_container_names[2];
                default:
                    assert(false);
                    __builtin_unreachable();
                    return "unknown";
            }
            break;
        default:
            assert(false);
            __builtin_unreachable();
            return "unknown";
    }
    __builtin_unreachable();
    return NULL;
}